

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O3

bool __thiscall DyndepParser::ParseEdge(DyndepParser *this,string *err)

{
  Lexer *this_00;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  uint uVar8;
  _Alloc_hider _Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  _Base_ptr *this_02;
  pair<std::_Rb_tree_iterator<std::pair<Edge_*const,_Dyndeps>_>,_bool> pVar10;
  string path;
  EvalString out;
  string rule_name;
  vector<EvalString,_std::allocator<EvalString>_> ins;
  vector<EvalString,_std::allocator<EvalString>_> outs;
  Node *n;
  uint64_t slash_bits;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  _Base_ptr *local_100;
  undefined1 local_f8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  pointer local_d8;
  pointer local_d0;
  pointer ppNStack_c8;
  pointer local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  EvalString *local_70;
  BindingEnv *local_68;
  Node *local_60;
  EvalString local_58;
  _Base_ptr *local_38;
  
  local_b8._M_dataplus._M_p = (pointer)0x0;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  this_00 = &(this->super_Parser).lexer_;
  bVar1 = Lexer::ReadEvalString(this_00,(EvalString *)&local_b8,true,err);
  if (bVar1) {
    if (local_b8._M_dataplus._M_p == (pointer)local_b8._M_string_length) {
      local_f8 = (undefined1  [8])&local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"expected path","");
      bVar2 = Lexer::Error(this_00,(string *)local_f8,err);
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
      goto LAB_0010f390;
    }
    local_68 = &this->env_;
    EvalString::Evaluate_abi_cxx11_(&local_158,(EvalString *)&local_b8,&local_68->super_Env);
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity =
         local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    bVar1 = CanonicalizePath(&local_158,(uint64_t *)&local_58,&local_98);
    if (bVar1) {
      path_00.len_ = local_158._M_string_length;
      path_00.str_ = local_158._M_dataplus._M_p;
      pNVar5 = State::LookupNode((this->super_Parser).state_,path_00);
      if ((pNVar5 == (Node *)0x0) ||
         (local_f8 = (undefined1  [8])pNVar5->in_edge_, local_f8 == (undefined1  [8])0x0)) {
        std::operator+(&local_138,"no build statement exists for \'",&local_158);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_f8 = (undefined1  [8])&local_e8;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar7) {
          local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_e8._8_8_ = plVar6[3];
        }
        else {
          local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_f8 = (undefined1  [8])*plVar6;
        }
        paStack_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)plVar6[1];
        *plVar6 = (long)paVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        bVar1 = Lexer::Error(this_00,(string *)local_f8,err);
LAB_0010f513:
        uVar8 = (uint)bVar1;
        if (local_f8 != (undefined1  [8])&local_e8) {
          operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
            &local_138.field_2) {
          operator_delete((undefined1 *)
                          CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_
                                  ),local_138.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0010f547;
      }
      local_138._M_dataplus._M_p._0_2_ = 0;
      paStack_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((ulong)paStack_f0 & 0xffffffffffff0000);
      local_e8._M_allocated_capacity = 0;
      local_e8._8_8_ = (pointer)0x0;
      local_d8 = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      local_138.field_2._8_8_ = 0;
      local_d0 = (pointer)0x0;
      ppNStack_c8 = (pointer)0x0;
      local_c0 = (pointer)0x0;
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0;
      pVar10 = std::
               _Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
               ::_M_insert_unique<std::pair<Edge*const,Dyndeps>>
                         ((_Rb_tree<Edge*,std::pair<Edge*const,Dyndeps>,std::_Select1st<std::pair<Edge*const,Dyndeps>>,std::less<Edge*>,std::allocator<std::pair<Edge*const,Dyndeps>>>
                           *)this->dyndep_file_,(pair<Edge_*const,_Dyndeps> *)local_f8);
      uVar8 = pVar10._8_4_;
      if (local_d0 != (pointer)0x0) {
        operator_delete(local_d0,(long)local_c0 - (long)local_d0);
      }
      if ((pointer)local_e8._M_allocated_capacity != (pointer)0x0) {
        operator_delete((void *)local_e8._M_allocated_capacity,(long)local_d8 - local_e8._0_8_);
      }
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::operator+(&local_138,"multiple statements for \'",&local_158);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_f8 = (undefined1  [8])&local_e8;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar6 == paVar7) {
          local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_e8._8_8_ = plVar6[3];
        }
        else {
          local_e8._M_allocated_capacity = paVar7->_M_allocated_capacity;
          local_f8 = (undefined1  [8])*plVar6;
        }
        paStack_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)plVar6[1];
        *plVar6 = (long)paVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        bVar1 = Lexer::Error(this_00,(string *)local_f8,err);
        goto LAB_0010f513;
      }
      local_100 = &pVar10.first._M_node._M_node[1]._M_parent;
      bVar1 = true;
    }
    else {
      bVar1 = Lexer::Error(this_00,&local_98,err);
      uVar8 = (uint)bVar1;
LAB_0010f547:
      bVar1 = false;
      local_100 = (_Base_ptr *)0x0;
    }
    bVar2 = (byte)uVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               *)&local_b8);
    if (!bVar1) goto LAB_0010f39d;
    local_138._M_dataplus._M_p._0_2_ = 0;
    local_138._M_dataplus._M_p._2_6_ = 0;
    local_138._M_string_length = 0;
    local_138.field_2._M_allocated_capacity = 0;
    bVar1 = Lexer::ReadEvalString(this_00,(EvalString *)&local_138,true,err);
    if (bVar1) {
      if (CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) ==
          local_138._M_string_length) {
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   *)&local_138);
        local_98._M_dataplus._M_p = (pointer)0x0;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity = 0;
        bVar1 = Lexer::PeekToken(this_00,PIPE);
        if (bVar1) {
          while( true ) {
            local_f8 = (undefined1  [8])0x0;
            paStack_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
            local_e8._M_allocated_capacity = 0;
            bVar1 = Lexer::ReadEvalString(this_00,(EvalString *)local_f8,true,err);
            if (!bVar1) break;
            if (local_f8 == (undefined1  [8])paStack_f0) {
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)local_f8);
              goto LAB_0010f6d4;
            }
            std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                      ((vector<EvalString,_std::allocator<EvalString>_> *)&local_98,
                       (EvalString *)local_f8);
            std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                       *)local_f8);
          }
          bVar2 = err != (string *)0x0;
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                     *)local_f8);
        }
        else {
LAB_0010f6d4:
          bVar1 = Parser::ExpectToken(&this->super_Parser,COLON,err);
          if (bVar1) {
            local_f8 = (undefined1  [8])&local_e8;
            paStack_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)0x0;
            local_e8._M_allocated_capacity = local_e8._M_allocated_capacity & 0xffffffffffffff00;
            bVar1 = Lexer::ReadIdent(this_00,(string *)local_f8);
            if ((bVar1) && (iVar4 = std::__cxx11::string::compare(local_f8), iVar4 == 0)) {
              local_158._M_dataplus._M_p = (pointer)0x0;
              local_158._M_string_length = 0;
              local_158.field_2._M_allocated_capacity = 0;
              bVar1 = Lexer::ReadEvalString(this_00,(EvalString *)&local_158,true,err);
              if (bVar1) {
                if (local_158._M_dataplus._M_p == (pointer)local_158._M_string_length) {
                  std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                             *)&local_158);
                  local_b8._M_dataplus._M_p = (pointer)0x0;
                  local_b8._M_string_length = 0;
                  local_b8.field_2._M_allocated_capacity = 0;
                  bVar1 = Lexer::PeekToken(this_00,PIPE);
                  if (bVar1) {
                    while( true ) {
                      local_138._M_dataplus._M_p._0_2_ = 0;
                      local_138._M_dataplus._M_p._2_6_ = 0;
                      local_138._M_string_length = 0;
                      local_138.field_2._M_allocated_capacity = 0;
                      bVar1 = Lexer::ReadEvalString(this_00,(EvalString *)&local_138,true,err);
                      if (!bVar1) break;
                      if (CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_
                                  ) == local_138._M_string_length) {
                        std::
                        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                   *)&local_138);
                        goto LAB_0010f8de;
                      }
                      std::vector<EvalString,_std::allocator<EvalString>_>::push_back
                                ((vector<EvalString,_std::allocator<EvalString>_> *)&local_b8,
                                 (value_type *)&local_138);
                      std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                 *)&local_138);
                    }
                    bVar2 = err != (string *)0x0;
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                               *)&local_138);
                  }
                  else {
LAB_0010f8de:
                    bVar1 = Lexer::PeekToken(this_00,PIPE2);
                    if (bVar1) {
                      paVar7 = &local_138.field_2;
                      local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
                      local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_138,"order-only inputs not supported","");
                      bVar2 = Lexer::Error(this_00,&local_138,err);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                      local_138._M_dataplus._M_p._0_2_) != paVar7) {
                        operator_delete((undefined1 *)
                                        CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                                 local_138._M_dataplus._M_p._0_2_),
                                        local_138.field_2._M_allocated_capacity + 1);
                      }
                    }
                    else {
                      bVar1 = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
                      if (bVar1) {
                        bVar1 = Lexer::PeekToken(this_00,INDENT);
                        if (bVar1) {
                          paVar7 = &local_138.field_2;
                          local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
                          local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
                          local_138._M_string_length = 0;
                          local_138.field_2._M_allocated_capacity =
                               local_138.field_2._M_allocated_capacity & 0xffffffffffffff00;
                          local_58.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                          local_58.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          local_58.parsed_.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                          bVar1 = ParseLet(this,&local_138,&local_58,err);
                          if (bVar1) {
                            iVar4 = std::__cxx11::string::compare((char *)&local_138);
                            if (iVar4 == 0) {
                              EvalString::Evaluate_abi_cxx11_
                                        (&local_158,&local_58,&local_68->super_Env);
                              *(bool *)((long)local_100 + 1) =
                                   (char *)local_158._M_string_length != (char *)0x0;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                                operator_delete(local_158._M_dataplus._M_p,
                                                local_158.field_2._M_allocated_capacity + 1);
                              }
                              bVar1 = true;
                            }
                            else {
                              local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_158,"binding is not \'restat\'","");
                              bVar1 = Lexer::Error(this_00,&local_158,err);
                              uVar8 = (uint)bVar1;
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_158._M_dataplus._M_p != &local_158.field_2) {
                                operator_delete(local_158._M_dataplus._M_p,
                                                local_158.field_2._M_allocated_capacity + 1);
                              }
                              bVar1 = false;
                            }
                          }
                          else {
                            bVar1 = false;
                            uVar8 = 0;
                          }
                          bVar2 = (byte)uVar8;
                          std::
                          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                          ::~vector(&local_58.parsed_);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                          local_138._M_dataplus._M_p._0_2_) != paVar7) {
                            operator_delete((undefined1 *)
                                            CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                                     local_138._M_dataplus._M_p._0_2_),
                                            local_138.field_2._M_allocated_capacity + 1);
                          }
                          if (!bVar1) goto LAB_0010fd26;
                        }
                        local_38 = local_100 + 1;
                        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,
                                   ((long)(local_b8._M_string_length -
                                          (long)local_b8._M_dataplus._M_p) >> 3) *
                                   -0x5555555555555555);
                        if (local_b8._M_dataplus._M_p != (pointer)local_b8._M_string_length) {
                          _Var9._M_p = local_b8._M_dataplus._M_p;
                          do {
                            local_70 = (EvalString *)_Var9._M_p;
                            EvalString::Evaluate_abi_cxx11_
                                      (&local_138,(EvalString *)_Var9._M_p,&local_68->super_Env);
                            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                            local_158._M_string_length = 0;
                            local_158.field_2._M_allocated_capacity =
                                 local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            bVar1 = CanonicalizePath(&local_138,(uint64_t *)&local_58,&local_158);
                            if (bVar1) {
                              path_01.str_._2_6_ = local_138._M_dataplus._M_p._2_6_;
                              path_01.str_._0_2_ = local_138._M_dataplus._M_p._0_2_;
                              path_01.len_ = local_138._M_string_length;
                              local_60 = State::GetNode((this->super_Parser).state_,path_01,
                                                        (uint64_t)
                                                        local_58.parsed_.
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                        ((vector<Node_*,_std::allocator<Node_*>_> *)local_38,
                                         &local_60);
                            }
                            else {
                              bVar3 = Lexer::Error(this_00,&local_158,err);
                              uVar8 = (uint)bVar3;
                            }
                            bVar2 = (byte)uVar8;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
                              operator_delete(local_158._M_dataplus._M_p,
                                              local_158.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                            local_138._M_dataplus._M_p._0_2_) != &local_138.field_2)
                            {
                              operator_delete((undefined1 *)
                                              CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                                       local_138._M_dataplus._M_p._0_2_),
                                              local_138.field_2._M_allocated_capacity + 1);
                            }
                            if (!bVar1) goto LAB_0010fd26;
                            _Var9._M_p = (pointer)(local_70 + 1);
                          } while (_Var9._M_p != (pointer)local_b8._M_string_length);
                        }
                        this_02 = local_100 + 4;
                        std::vector<Node_*,_std::allocator<Node_*>_>::reserve
                                  ((vector<Node_*,_std::allocator<Node_*>_> *)this_02,
                                   ((long)(local_98._M_string_length -
                                          (long)local_98._M_dataplus._M_p) >> 3) *
                                   -0x5555555555555555);
                        if (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length) {
                          _Var9._M_p = local_98._M_dataplus._M_p;
                          local_100 = this_02;
                          do {
                            local_70 = (EvalString *)_Var9._M_p;
                            EvalString::Evaluate_abi_cxx11_
                                      (&local_138,(EvalString *)_Var9._M_p,&local_68->super_Env);
                            local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                            local_158._M_string_length = 0;
                            local_158.field_2._M_allocated_capacity =
                                 local_158.field_2._M_allocated_capacity & 0xffffffffffffff00;
                            bVar1 = CanonicalizePath(&local_138,(uint64_t *)&local_58,&local_158);
                            if (bVar1) {
                              path_02.str_._2_6_ = local_138._M_dataplus._M_p._2_6_;
                              path_02.str_._0_2_ = local_138._M_dataplus._M_p._0_2_;
                              path_02.len_ = local_138._M_string_length;
                              local_60 = State::GetNode((this->super_Parser).state_,path_02,
                                                        (uint64_t)
                                                        local_58.parsed_.
                                                                                                                
                                                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                                        ((vector<Node_*,_std::allocator<Node_*>_> *)local_100,
                                         &local_60);
                            }
                            else {
                              bVar3 = Lexer::Error(this_00,&local_158,err);
                              uVar8 = (uint)bVar3;
                            }
                            bVar2 = (byte)uVar8;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_158._M_dataplus._M_p != &local_158.field_2) {
                              operator_delete(local_158._M_dataplus._M_p,
                                              local_158.field_2._M_allocated_capacity + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                            local_138._M_dataplus._M_p._0_2_) != &local_138.field_2)
                            {
                              operator_delete((undefined1 *)
                                              CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                                       local_138._M_dataplus._M_p._0_2_),
                                              local_138.field_2._M_allocated_capacity + 1);
                            }
                            if (!bVar1) goto LAB_0010fd26;
                            _Var9._M_p = (pointer)(local_70 + 1);
                          } while (_Var9._M_p != (pointer)local_98._M_string_length);
                        }
                        bVar2 = 1;
                      }
                      else {
                        bVar2 = 0;
                      }
                    }
                  }
LAB_0010fd26:
                  std::vector<EvalString,_std::allocator<EvalString>_>::~vector
                            ((vector<EvalString,_std::allocator<EvalString>_> *)&local_b8);
                  goto LAB_0010f80a;
                }
                paVar7 = &local_138.field_2;
                local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
                local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_138,"explicit inputs not supported","");
                bVar2 = Lexer::Error(this_00,&local_138,err);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_)
                    != paVar7) {
                  operator_delete((undefined1 *)
                                  CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                           local_138._M_dataplus._M_p._0_2_),
                                  local_138.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                bVar2 = false;
              }
              std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                         *)&local_158);
            }
            else {
              paVar7 = &local_138.field_2;
              local_138._M_dataplus._M_p._0_2_ = SUB82(paVar7,0);
              local_138._M_dataplus._M_p._2_6_ = (undefined6)((ulong)paVar7 >> 0x10);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_138,"expected build command name \'dyndep\'","");
              bVar2 = Lexer::Error(this_00,&local_138,err);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT62(local_138._M_dataplus._M_p._2_6_,local_138._M_dataplus._M_p._0_2_) !=
                  paVar7) {
                operator_delete((undefined1 *)
                                CONCAT62(local_138._M_dataplus._M_p._2_6_,
                                         local_138._M_dataplus._M_p._0_2_),
                                local_138.field_2._M_allocated_capacity + 1);
              }
            }
LAB_0010f80a:
            if (local_f8 != (undefined1  [8])&local_e8) {
              operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
            }
          }
          else {
            bVar2 = 0;
          }
        }
        std::vector<EvalString,_std::allocator<EvalString>_>::~vector
                  ((vector<EvalString,_std::allocator<EvalString>_> *)&local_98);
        goto LAB_0010f39d;
      }
      local_f8 = (undefined1  [8])&local_e8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"explicit outputs not supported","");
      bVar2 = Lexer::Error(this_00,(string *)local_f8,err);
      if (local_f8 != (undefined1  [8])&local_e8) {
        operator_delete((void *)local_f8,local_e8._M_allocated_capacity + 1);
      }
    }
    else {
      bVar2 = false;
    }
    this_01 = &local_138;
  }
  else {
    bVar2 = false;
LAB_0010f390:
    this_01 = &local_b8;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
             *)this_01);
LAB_0010f39d:
  return (bool)(bVar2 & 1);
}

Assistant:

bool DyndepParser::ParseEdge(string* err) {
  // Parse one explicit output.  We expect it to already have an edge.
  // We will record its dynamically-discovered dependency information.
  Dyndeps* dyndeps = NULL;
  {
    EvalString out0;
    if (!lexer_.ReadPath(&out0, err))
      return false;
    if (out0.empty())
      return lexer_.Error("expected path", err);

    string path = out0.Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* node = state_->LookupNode(path);
    if (!node || !node->in_edge())
      return lexer_.Error("no build statement exists for '" + path + "'", err);
    Edge* edge = node->in_edge();
    std::pair<DyndepFile::iterator, bool> res =
      dyndep_file_->insert(DyndepFile::value_type(edge, Dyndeps()));
    if (!res.second)
      return lexer_.Error("multiple statements for '" + path + "'", err);
    dyndeps = &res.first->second;
  }

  // Disallow explicit outputs.
  {
    EvalString out;
    if (!lexer_.ReadPath(&out, err))
      return false;
    if (!out.empty())
      return lexer_.Error("explicit outputs not supported", err);
  }

  // Parse implicit outputs, if any.
  vector<EvalString> outs;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString out;
      if (!lexer_.ReadPath(&out, err))
        return err;
      if (out.empty())
        break;
      outs.push_back(out);
    }
  }

  if (!ExpectToken(Lexer::COLON, err))
    return false;

  string rule_name;
  if (!lexer_.ReadIdent(&rule_name) || rule_name != "dyndep")
    return lexer_.Error("expected build command name 'dyndep'", err);

  // Disallow explicit inputs.
  {
    EvalString in;
    if (!lexer_.ReadPath(&in, err))
      return false;
    if (!in.empty())
      return lexer_.Error("explicit inputs not supported", err);
  }

  // Parse implicit inputs, if any.
  vector<EvalString> ins;
  if (lexer_.PeekToken(Lexer::PIPE)) {
    for (;;) {
      EvalString in;
      if (!lexer_.ReadPath(&in, err))
        return err;
      if (in.empty())
        break;
      ins.push_back(in);
    }
  }

  // Disallow order-only inputs.
  if (lexer_.PeekToken(Lexer::PIPE2))
    return lexer_.Error("order-only inputs not supported", err);

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  if (lexer_.PeekToken(Lexer::INDENT)) {
    string key;
    EvalString val;
    if (!ParseLet(&key, &val, err))
      return false;
    if (key != "restat")
      return lexer_.Error("binding is not 'restat'", err);
    string value = val.Evaluate(&env_);
    dyndeps->restat_ = !value.empty();
  }

  dyndeps->implicit_inputs_.reserve(ins.size());
  for (vector<EvalString>::iterator i = ins.begin(); i != ins.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_inputs_.push_back(n);
  }

  dyndeps->implicit_outputs_.reserve(outs.size());
  for (vector<EvalString>::iterator i = outs.begin(); i != outs.end(); ++i) {
    string path = i->Evaluate(&env_);
    string path_err;
    uint64_t slash_bits;
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    Node* n = state_->GetNode(path, slash_bits);
    dyndeps->implicit_outputs_.push_back(n);
  }

  return true;
}